

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tfidfinit.cpp
# Opt level: O0

void readfile(char *data_file)

{
  bool bVar1;
  int iVar2;
  FILE *__stream;
  double *pdVar3;
  reference this;
  size_type sVar4;
  reference __x;
  reference pvVar5;
  difference_type dVar6;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Stack_30e50;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Stack_30e48;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Stack_30e40;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Stack_30e38;
  int iStack_30e2c;
  iterator iStack_30e28;
  int i_2;
  _Self _Stack_30e20;
  iterator it;
  double now_data;
  int j;
  int iStack_30df8;
  int iStack_30df4;
  double dStack_30df0;
  double now_label;
  undefined1 auStack_30de0 [4];
  int i_1;
  vector<int,_std::allocator<int>_> all_label;
  set<int,_std::less<int>,_std::allocator<int>_> pool;
  vector<double,_std::allocator<double>_> vStack_30d88;
  int iStack_30d64;
  char *pcStack_30d60;
  int i;
  char *tmp;
  char buff [200000];
  FILE *f;
  char *data_file_local;
  
  __stream = fopen(data_file,"r");
  for (iStack_30d64 = 0; iStack_30d64 < data_n; iStack_30d64 = iStack_30d64 + 1) {
    vStack_30d88.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
    ._M_start = (pointer)0x0;
    vStack_30d88.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
    ._M_finish = (pointer)0x0;
    vStack_30d88.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
    ._M_end_of_storage = (pointer)0x0;
    std::vector<double,_std::allocator<double>_>::vector(&vStack_30d88);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::push_back(&data_x,&vStack_30d88);
    std::vector<double,_std::allocator<double>_>::~vector(&vStack_30d88);
  }
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)
             &all_label.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)auStack_30de0)
  ;
  for (now_label._4_4_ = 0; now_label._4_4_ < data_n; now_label._4_4_ = now_label._4_4_ + 1) {
    fgets((char *)&tmp,200000,__stream);
    pcStack_30d60 = strtok((char *)&tmp,", \r\n");
    iVar2 = atoi(pcStack_30d60);
    dStack_30df0 = (double)iVar2;
    iStack_30df4 = (int)dStack_30df0;
    std::vector<int,_std::allocator<int>_>::push_back(&label,&iStack_30df4);
    iStack_30df8 = (int)dStack_30df0;
    std::set<int,_std::less<int>,_std::allocator<int>_>::insert
              ((set<int,_std::less<int>,_std::allocator<int>_> *)
               &all_label.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,&iStack_30df8);
    pcStack_30d60 = strtok((char *)0x0,", \r\n");
    for (now_data._4_4_ = 0; now_data._4_4_ < ts_len; now_data._4_4_ = now_data._4_4_ + 1) {
      it._M_node = (_Base_ptr)atof(pcStack_30d60);
      pdVar3 = std::max<double>(&max_data,(double *)&it);
      max_data = *pdVar3;
      pdVar3 = std::min<double>(&min_data,(double *)&it);
      min_data = *pdVar3;
      this = std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::operator[](&data_x,(long)now_label._4_4_);
      std::vector<double,_std::allocator<double>_>::push_back(this,(value_type *)&it);
      pcStack_30d60 = strtok((char *)0x0,", \r\n");
    }
  }
  sVar4 = std::set<int,_std::less<int>,_std::allocator<int>_>::size
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)
                     &all_label.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  num_c = (int)sVar4;
  _Stack_30e20._M_node =
       (_Base_ptr)
       std::set<int,_std::less<int>,_std::allocator<int>_>::begin
                 ((set<int,_std::less<int>,_std::allocator<int>_> *)
                  &all_label.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage);
  while( true ) {
    iStack_30e28 = std::set<int,_std::less<int>,_std::allocator<int>_>::end
                             ((set<int,_std::less<int>,_std::allocator<int>_> *)
                              &all_label.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage);
    bVar1 = std::operator!=(&_Stack_30e20,&stack0xfffffffffffcf1d8);
    if (!bVar1) break;
    __x = std::_Rb_tree_const_iterator<int>::operator*(&_Stack_30e20);
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)auStack_30de0,__x);
    std::_Rb_tree_const_iterator<int>::operator++(&_Stack_30e20);
  }
  for (iStack_30e2c = 0; iStack_30e2c < data_n; iStack_30e2c = iStack_30e2c + 1) {
    _Stack_30e40._M_current =
         (int *)std::vector<int,_std::allocator<int>_>::begin
                          ((vector<int,_std::allocator<int>_> *)auStack_30de0);
    _Stack_30e48._M_current =
         (int *)std::vector<int,_std::allocator<int>_>::end
                          ((vector<int,_std::allocator<int>_> *)auStack_30de0);
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&label,(long)iStack_30e2c);
    _Stack_30e38 = std::
                   lower_bound<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int>
                             (_Stack_30e40,_Stack_30e48,pvVar5);
    _Stack_30e50._M_current =
         (int *)std::vector<int,_std::allocator<int>_>::begin
                          ((vector<int,_std::allocator<int>_> *)auStack_30de0);
    dVar6 = __gnu_cxx::operator-(&_Stack_30e38,&_Stack_30e50);
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&label,(long)iStack_30e2c);
    *pvVar5 = (value_type)dVar6;
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&label,(long)iStack_30e2c);
    datacnt[*pvVar5] = datacnt[*pvVar5] + 1;
  }
  max_data = max_data + ((max_data - min_data) / 10.0) / 100.0;
  bucket_w = (max_data - min_data) / 10.0;
  fclose(__stream);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)auStack_30de0);
  std::set<int,_std::less<int>,_std::allocator<int>_>::~set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)
             &all_label.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void readfile(char *data_file) {
    FILE *f;
    f = fopen(data_file, "r");

    char buff[MAX_CHAR_PER_LINE];
    char *tmp;

    for (int i = 0; i < data_n; ++i) {
        data_x.push_back(vector<double>());
    }

    set<int> pool;
    vector<int> all_label;

    for (int i = 0; i < data_n; i++) {
        fgets(buff, MAX_CHAR_PER_LINE, f);
        tmp = strtok(buff, ", \r\n");

        double now_label = atoi(tmp);
        label.push_back(now_label);
        pool.insert(now_label);

        tmp = strtok(NULL, ", \r\n");
        for (int j = 0; j < ts_len; ++j) {

            double now_data = atof(tmp);
            max_data = max(max_data, now_data);
            min_data = min(min_data, now_data);

            data_x[i].push_back(now_data);
            tmp = strtok(NULL, ", \r\n");
        }
    }

    num_c = pool.size();
//    for (int item : pool) {
//        all_label.push_back(item);
//    }
    for (set<int>::iterator it = pool.begin(); it != pool.end(); ++it) {
        all_label.push_back(*it);
    }

    for (int i = 0; i < data_n; ++i) {
        label[i] = lower_bound(all_label.begin(), all_label.end(), label[i]) - all_label.begin();
        ++datacnt[label[i]];
    }

    bucket_w = (max_data - min_data) / PAA_BUCKET;
    max_data += bucket_w / 100;
    bucket_w = (max_data - min_data) / PAA_BUCKET;

    fclose(f);
}